

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_intersect_with_range(roaring_bitmap_t *bm,uint64_t x,uint64_t y)

{
  _Bool _Var1;
  ulong in_RDX;
  ulong in_RSI;
  roaring_uint32_iterator_t it;
  roaring_uint32_iterator_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc4;
  roaring_uint32_iterator_t *in_stack_ffffffffffffffc8;
  undefined4 local_28;
  undefined1 local_1;
  
  if (in_RSI < in_RDX) {
    roaring_iterator_init
              ((roaring_bitmap_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    _Var1 = roaring_uint32_iterator_move_equalorlarger
                      (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
    if (_Var1) {
      if (local_28 < in_RDX) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool roaring_bitmap_intersect_with_range(const roaring_bitmap_t *bm, uint64_t x,
                                         uint64_t y) {
    if (x >= y) {
        // Empty range.
        return false;
    }
    roaring_uint32_iterator_t it;
    roaring_iterator_init(bm, &it);
    if (!roaring_uint32_iterator_move_equalorlarger(&it, (uint32_t)x)) {
        // No values above x.
        return false;
    }
    if (it.current_value >= y) {
        // No values below y.
        return false;
    }
    return true;
}